

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::PushPopCommBuf::execute(PushPopCommBuf *this,Rdma *rdma)

{
  void *pvVar1;
  size_t sVar2;
  iterator iVar3;
  Memslot MVar4;
  size_type sVar5;
  reference pvVar6;
  exception *peVar7;
  exception *peVar8;
  Memblock *pMVar9;
  reference pvVar10;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  _Var11;
  pointer ppVar12;
  reference puVar13;
  reference puVar14;
  bool bVar15;
  int local_7ac;
  int p_2;
  const_iterator local_790;
  undefined1 local_781;
  exception local_780;
  _Self local_5e0;
  int local_5d8;
  byte local_5d1;
  int p_1;
  bool all_nulls;
  _List_node_base *local_5c8;
  list<unsigned_long,_std::allocator<unsigned_long>_> *local_5c0;
  RegStack *stack_1;
  exception local_5b0;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_410;
  key_type local_408;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_400;
  _List_node_base *local_3f8;
  undefined1 local_3e9;
  exception local_3e8;
  undefined1 local_248 [16];
  _List_iterator<unsigned_long> local_238;
  _List_iterator<unsigned_long> local_230;
  reverse_iterator j;
  RegStack *stack;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_218;
  void *local_210;
  void *addr;
  iterator rs;
  iterator reg_entry;
  Memslot id_1;
  size_t s_1;
  exception local_1d8;
  int local_34;
  Memslot MStack_30;
  int p;
  Memslot id;
  size_t s;
  int nprocs;
  int pid;
  Rdma *rdma_local;
  PushPopCommBuf *this_local;
  
  s._4_4_ = rdma->m_pid;
  s._0_4_ = rdma->m_nprocs;
  _nprocs = rdma;
  rdma_local = (Rdma *)this;
  for (id = 0; MVar4 = id,
      sVar5 = std::
              vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
              ::size(&this->m_pushed_slots), MVar4 < sVar5 / (ulong)(long)(int)s; id = id + 1) {
    pvVar6 = std::
             vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
             ::operator[](&this->m_pushed_slots,id * (long)(int)s);
    MStack_30 = pvVar6->slot;
    for (local_34 = 0; local_34 < (int)s; local_34 = local_34 + 1) {
      pvVar6 = std::
               vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ::operator[](&this->m_pushed_slots,id * (long)(int)s + (long)local_34);
      if (pvVar6->slot != MStack_30) {
        peVar7 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_1d8,"bsp_push_reg");
        peVar8 = exception::operator<<
                           (&local_1d8,(char (*) [37])"Internal error; inconsistent slot id");
        exception::exception(peVar7,peVar8);
        __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
      }
      pvVar6 = std::
               vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ::operator[](&this->m_pushed_slots,id * (long)(int)s + (long)local_34);
      pvVar1 = (pvVar6->block).addr;
      pMVar9 = slot(_nprocs,local_34,MStack_30);
      pMVar9->addr = pvVar1;
      pvVar6 = std::
               vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ::operator[](&this->m_pushed_slots,id * (long)(int)s + (long)local_34);
      sVar2 = (pvVar6->block).size;
      pMVar9 = slot(_nprocs,local_34,MStack_30);
      pMVar9->size = sVar2;
      pMVar9 = slot(_nprocs,local_34,MStack_30);
      pMVar9->status = pMVar9->status & 0xfffffffe;
    }
  }
  id_1 = 0;
  do {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_popped_slots);
    if (sVar5 <= id_1) {
      return;
    }
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&this->m_popped_slots,id_1);
    reg_entry.
    super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
               )*pvVar10;
    std::__detail::
    _Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
    ::_Node_iterator((_Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                      *)&rs);
    std::_List_iterator<unsigned_long>::_List_iterator((_List_iterator<unsigned_long> *)&addr);
    iVar3 = reg_entry;
    _Var11._M_cur = (__node_type *)no_slot();
    if (iVar3.
        super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
        ._M_cur ==
        (_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
         )_Var11._M_cur) {
      local_408 = (key_type)0x0;
      local_400._M_cur =
           (__node_type *)
           std::
           unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::find(&_nprocs->m_register,&local_408);
      rs._M_node = (_List_node_base *)local_400._M_cur;
      local_410._M_cur =
           (__node_type *)
           std::
           unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::end(&_nprocs->m_register);
      bVar15 = std::__detail::operator==
                         ((_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                           *)&rs,&local_410);
      if (bVar15) {
        stack_1._7_1_ = 1;
        peVar7 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_5b0,"bsp_pop_reg");
        peVar8 = exception::operator<<
                           (&local_5b0,
                            (char (*) [73])
                            "Tried to deregister NULL on all processes, but NULL was never registered"
                           );
        exception::exception(peVar7,peVar8);
        stack_1._7_1_ = 0;
        __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
      }
      ppVar12 = std::__detail::
                _Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                ::operator->((_Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                              *)&rs);
      local_5c0 = &ppVar12->second;
      local_5c8 = (_List_node_base *)
                  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            (local_5c0);
      addr = local_5c8;
      while( true ) {
        _p_1 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end(local_5c0);
        bVar15 = std::operator!=((_Self *)&addr,(_Self *)&p_1);
        if (!bVar15) break;
        puVar14 = std::_List_iterator<unsigned_long>::operator*
                            ((_List_iterator<unsigned_long> *)&addr);
        reg_entry.
        super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                   )*puVar14;
        local_5d1 = 1;
        for (local_5d8 = 0; local_5d8 < (int)s; local_5d8 = local_5d8 + 1) {
          pMVar9 = slot(_nprocs,local_5d8,
                        (Memslot)reg_entry.
                                 super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                 ._M_cur);
          if (pMVar9->addr != (void *)0x0) {
            local_5d1 = 0;
            break;
          }
        }
        if ((local_5d1 & 1) != 0) break;
        std::_List_iterator<unsigned_long>::operator++((_List_iterator<unsigned_long> *)&addr);
      }
      local_5e0._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end(local_5c0);
      bVar15 = std::operator==((_Self *)&addr,&local_5e0);
      if (bVar15) {
        local_781 = 1;
        peVar7 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_780,"bsp_pop_reg");
        peVar8 = exception::operator<<
                           (&local_780,
                            (char (*) [100])
                            "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)"
                           );
        exception::exception(peVar7,peVar8);
        local_781 = 0;
        __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
      }
    }
    else {
      pMVar9 = slot(_nprocs,s._4_4_,
                    (Memslot)reg_entry.
                             super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur);
      bVar15 = true;
      if (pMVar9->addr != (void *)0x0) {
        pMVar9 = slot(_nprocs,s._4_4_,
                      (Memslot)reg_entry.
                               super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                               ._M_cur);
        bVar15 = (pMVar9->status & 2) != 0;
      }
      if (!bVar15) {
        __assert_fail("rdma.slot(pid,id).addr == NULL || rdma.slot( pid, id ).status & Memblock::POPPED"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                      ,0x1fe,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
      }
      pMVar9 = slot(_nprocs,s._4_4_,
                    (Memslot)reg_entry.
                             super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur);
      local_210 = pMVar9->addr;
      local_218._M_cur =
           (__node_type *)
           std::
           unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::find(&_nprocs->m_register,&local_210);
      rs._M_node = (_List_node_base *)local_218._M_cur;
      stack = (RegStack *)
              std::
              unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::end(&_nprocs->m_register);
      bVar15 = std::__detail::operator!=
                         ((_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                           *)&rs,(_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                  *)&stack);
      if (!bVar15) {
        __assert_fail("reg_entry != rdma.m_register.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                      ,0x201,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
      }
      ppVar12 = std::__detail::
                _Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                ::operator->((_Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                              *)&rs);
      j.current._M_node = (_List_iterator<unsigned_long>)&ppVar12->second;
      std::reverse_iterator<std::_List_iterator<unsigned_long>_>::reverse_iterator
                ((reverse_iterator<std::_List_iterator<unsigned_long>_> *)&stack0xfffffffffffffdd0);
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::rbegin
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdc8);
      local_230._M_node = local_238._M_node;
      while( true ) {
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::rend
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(local_248 + 8));
        bVar15 = std::operator!=((reverse_iterator<std::_List_iterator<unsigned_long>_> *)
                                 &stack0xfffffffffffffdd0,
                                 (reverse_iterator<std::_List_iterator<unsigned_long>_> *)
                                 (local_248 + 8));
        if ((!bVar15) ||
           (puVar13 = std::reverse_iterator<std::_List_iterator<unsigned_long>_>::operator*
                                ((reverse_iterator<std::_List_iterator<unsigned_long>_> *)
                                 &stack0xfffffffffffffdd0),
           (__node_type *)*puVar13 ==
           reg_entry.
           super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
           ._M_cur)) break;
        std::reverse_iterator<std::_List_iterator<unsigned_long>_>::operator++
                  ((reverse_iterator<std::_List_iterator<unsigned_long>_> *)&stack0xfffffffffffffdd0
                  );
      }
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::rend
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_248);
      bVar15 = std::operator==((reverse_iterator<std::_List_iterator<unsigned_long>_> *)
                               &stack0xfffffffffffffdd0,
                               (reverse_iterator<std::_List_iterator<unsigned_long>_> *)local_248);
      if (bVar15) {
        local_3e9 = 1;
        peVar7 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_3e8,"bsp_pop_reg");
        peVar8 = exception::operator<<
                           (&local_3e8,(char (*) [37])"Internal error: inconsistent slot id");
        exception::exception(peVar7,peVar8);
        local_3e9 = 0;
        __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
      }
      local_3f8 = (_List_node_base *)
                  std::reverse_iterator<std::_List_iterator<unsigned_long>_>::base
                            ((reverse_iterator<std::_List_iterator<unsigned_long>_> *)
                             &stack0xfffffffffffffdd0);
      addr = local_3f8;
      std::_List_iterator<unsigned_long>::operator--((_List_iterator<unsigned_long> *)&addr);
    }
    puVar14 = std::_List_iterator<unsigned_long>::operator*((_List_iterator<unsigned_long> *)&addr);
    if ((__node_type *)*puVar14 !=
        reg_entry.
        super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
        ._M_cur) {
      __assert_fail("*rs == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x22d,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
    }
    ppVar12 = std::__detail::
              _Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
              ::operator->((_Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                            *)&rs);
    std::_List_const_iterator<unsigned_long>::_List_const_iterator(&local_790,(iterator *)&addr);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::erase
              (&ppVar12->second,local_790);
    ppVar12 = std::__detail::
              _Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
              ::operator->((_Node_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                            *)&rs);
    bVar15 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                       (&ppVar12->second);
    if (bVar15) {
      std::
      unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::erase(&_nprocs->m_register,(iterator)rs._M_node);
    }
    for (local_7ac = 0; local_7ac < (int)s; local_7ac = local_7ac + 1) {
      pMVar9 = slot(_nprocs,local_7ac,
                    (Memslot)reg_entry.
                             super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur);
      pMVar9->addr = (void *)0x0;
      pMVar9 = slot(_nprocs,local_7ac,
                    (Memslot)reg_entry.
                             super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur);
      pMVar9->size = 0;
      pMVar9 = slot(_nprocs,local_7ac,
                    (Memslot)reg_entry.
                             super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur);
      pMVar9->status = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&_nprocs->m_free_slots,(value_type_conflict1 *)&reg_entry);
    id_1 = id_1 + 1;
  } while( true );
}

Assistant:

void Rdma::PushPopCommBuf::execute( Rdma & rdma ) 
{
    const int pid = rdma.m_pid;
    const int nprocs = rdma.m_nprocs;
 
    /* do memory registrations */
    for (size_t s = 0; s < m_pushed_slots.size()/nprocs; ++s) {
        Memslot id = m_pushed_slots[s*nprocs].slot;

        for ( int p = 0 ; p < nprocs; ++p ) {
            if ( m_pushed_slots[ s*nprocs + p ].slot != id )
                throw exception("bsp_push_reg") << "Internal error; inconsistent slot id";

            rdma.slot( p, id ).addr = m_pushed_slots[ s*nprocs + p ].block.addr;
            rdma.slot( p, id ).size = m_pushed_slots[ s*nprocs + p ].block.size;
            rdma.slot( p, id ).status &= ~Memblock::PUSHED; 
        }
    }

    /* do memory deregistrations */
    for (size_t s = 0; s < m_popped_slots.size(); ++s) {
        Memslot id = m_popped_slots[s];

        Reg::iterator reg_entry;
        RegStack :: iterator rs; 

        if ( id != no_slot() ) {
            assert( rdma.slot(pid,id).addr == NULL
                   || rdma.slot( pid, id ).status & Memblock::POPPED );
            void * addr = rdma.slot( pid, id).addr;
            reg_entry = rdma.m_register.find( addr );
            assert( reg_entry != rdma.m_register.end() );
            RegStack & stack = reg_entry->second;
            RegStack :: reverse_iterator j ; 
            for (j = stack.rbegin(); j != stack.rend(); ++j )
                if ( *j == id ) break;

            if ( j == stack.rend() )
                throw exception("bsp_pop_reg") << "Internal error: inconsistent slot id";

            rs = j.base();
            --rs;
        }
        else
        { // then all processes have popped NULL
          // Let's delete the first full block of NULL we can encounter

            reg_entry = rdma.m_register.find( NULL );
            if( reg_entry == rdma.m_register.end() )
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but NULL was never registered";

            RegStack & stack = reg_entry->second;

            for ( rs = stack.begin(); rs != stack.end(); ++rs ) {

                id = *rs;

                bool all_nulls = true;
                for ( int p = 0; p < nprocs; ++p ) {
                    if ( rdma.slot( p, id ).addr != NULL ) {
                        all_nulls = false;
                        break;
                    }
                }

                if ( all_nulls ) {
                   break;
                }
            }
            if ( rs == stack.end() ) 
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)";
        }

        assert( *rs == id );
        reg_entry->second.erase( rs );

        if ( reg_entry->second.empty())
            rdma.m_register.erase( reg_entry );

        for (int p = 0; p < nprocs; ++p) {
            rdma.slot( p, id ).addr = NULL;
            rdma.slot( p, id ).size = 0;
            rdma.slot( p, id ).status = Memblock::NORMAL;
        }
        rdma.m_free_slots.push_back( id );
    }
}